

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
libDAI::ClusterGraph::ind_delta
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          ClusterGraph *this,size_t i)

{
  unsigned_long *__src;
  pointer *ppuVar1;
  pointer pVVar2;
  unsigned_long *puVar3;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  _Var4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __dest;
  size_t local_20;
  
  pVVar2 = (this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V1.
           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_20 = i;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_equals_val<libDAI::Var_const>>
                    (pVVar2,(this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V1.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_finish,pVVar2 + i);
  ind_Delta(__return_storage_ptr__,this,
            (long)_Var4._M_current -
            (long)(this->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V1.
                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4);
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                     ((__return_storage_ptr__->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start,
                      (__return_storage_ptr__->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_finish,&local_20);
  __src = __dest._M_current + 1;
  puVar3 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__src != puVar3) {
    memmove(__dest._M_current,__src,(long)puVar3 - (long)__src);
  }
  ppuVar1 = &(__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> ind_delta( size_t i ) const {
                std::vector<size_t> result = ind_Delta( V1(i) );
                std::vector<size_t>::iterator it = find( result.begin(), result.end(), i );
                result.erase( it );
                return result;
            }